

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_CutDsdBalancePinDelays_rec
              (If_DsdMan_t *p,int Id,int *pTimes,word *pRes,int *pnSupp,int nSuppAll,char *pPermLits
              )

{
  Vec_Wec_t *p_00;
  int iVar1;
  int iVar2;
  If_DsdObj_t *pObj_00;
  word wVar3;
  word D2;
  bool bVar4;
  int local_238 [2];
  int pCounter [15];
  int local_1f0;
  int local_1ec;
  int nCounter;
  int fXor;
  int Result;
  int Delay;
  int iFanin_2;
  int i_2;
  word pFaninRes_2 [15];
  Vec_Int_t *vCover;
  int Delays_1 [15];
  int local_110;
  int local_10c;
  int iFanin_1;
  int i_1;
  word pFaninRes_1 [15];
  int local_88;
  int Delays [3];
  int iFanin;
  int i;
  word Res1;
  word Res0;
  word pFaninRes [3];
  int iCutVar;
  If_DsdObj_t *pObj;
  int nSuppAll_local;
  int *pnSupp_local;
  word *pRes_local;
  int *pTimes_local;
  int Id_local;
  If_DsdMan_t *p_local;
  
  pObj_00 = If_DsdVecObj(&p->vObjs,Id);
  iVar1 = If_DsdObjType(pObj_00);
  if (iVar1 == 2) {
    iVar1 = *pnSupp;
    *pnSupp = iVar1 + 1;
    pFaninRes[2]._4_4_ = Abc_Lit2Var((int)pPermLits[iVar1]);
    wVar3 = If_CutPinDelayInit(pFaninRes[2]._4_4_);
    *pRes = wVar3;
    p_local._4_4_ = pTimes[pFaninRes[2]._4_4_];
  }
  else {
    iVar1 = If_DsdObjType(pObj_00);
    if (iVar1 == 5) {
      Delays[2] = 0;
      while( true ) {
        iVar1 = If_DsdObjFaninNum(pObj_00);
        bVar4 = false;
        if (Delays[2] < iVar1) {
          Delays[1] = If_DsdObjFaninLit(pObj_00,Delays[2]);
          bVar4 = Delays[1] != 0;
        }
        if (!bVar4) break;
        iVar1 = Abc_Lit2Var(Delays[1]);
        iVar1 = If_CutDsdBalancePinDelays_rec
                          (p,iVar1,pTimes,pFaninRes + (long)Delays[2] + -1,pnSupp,nSuppAll,pPermLits
                          );
        *(int *)((long)pFaninRes_1 + (long)Delays[2] * 4 + 0x74) = iVar1;
        Delays[2] = Delays[2] + 1;
      }
      wVar3 = If_CutPinDelayMax(Res0,pFaninRes[0],nSuppAll,1);
      D2 = If_CutPinDelayMax(Res0,pFaninRes[1],nSuppAll,1);
      wVar3 = If_CutPinDelayMax(wVar3,D2,nSuppAll,1);
      *pRes = wVar3;
      iVar1 = Abc_MaxInt(local_88,Delays[0]);
      iVar1 = Abc_MaxInt(pFaninRes_1[0xe]._4_4_,iVar1);
      p_local._4_4_ = iVar1 + 2;
    }
    else {
      iVar1 = If_DsdObjType(pObj_00);
      if (iVar1 == 6) {
        p_00 = p->vIsops[*(uint *)&pObj_00->field_0x4 >> 0x1b];
        iVar1 = If_DsdObjTruthId(p,pObj_00);
        pFaninRes_2[0xe] = (word)Vec_WecEntry(p_00,iVar1);
        iVar1 = Vec_IntSize((Vec_Int_t *)pFaninRes_2[0xe]);
        if (iVar1 < 1) {
          __assert_fail("Vec_IntSize(vCover) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x870,
                        "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                       );
        }
        local_10c = 0;
        while( true ) {
          iVar1 = If_DsdObjFaninNum(pObj_00);
          bVar4 = false;
          if (local_10c < iVar1) {
            local_110 = If_DsdObjFaninLit(pObj_00,local_10c);
            bVar4 = local_110 != 0;
          }
          if (!bVar4) break;
          iVar1 = Abc_Lit2Var(local_110);
          iVar1 = If_CutDsdBalancePinDelays_rec
                            (p,iVar1,pTimes,(word *)(&iFanin_1 + (long)local_10c * 2),pnSupp,
                             nSuppAll,pPermLits);
          Delays_1[(long)local_10c + -2] = iVar1;
          local_10c = local_10c + 1;
        }
        p_local._4_4_ =
             If_CutSopBalancePinDelaysInt
                       ((Vec_Int_t *)pFaninRes_2[0xe],(int *)&vCover,(word *)&iFanin_1,nSuppAll,pRes
                       );
      }
      else {
        iVar1 = If_DsdObjType(pObj_00);
        if (iVar1 != 3) {
          iVar1 = If_DsdObjType(pObj_00);
          if (iVar1 != 4) {
            __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                          ,0x875,
                          "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                         );
          }
        }
        nCounter = 0;
        local_1ec = 0;
        local_1f0 = 0;
        Delay = 0;
        while( true ) {
          iVar1 = Delay;
          iVar2 = If_DsdObjFaninNum(pObj_00);
          bVar4 = false;
          if (iVar1 < iVar2) {
            Result = If_DsdObjFaninLit(pObj_00,Delay);
            bVar4 = Result != 0;
          }
          if (!bVar4) break;
          iVar1 = Abc_Lit2Var(Result);
          fXor = If_CutDsdBalancePinDelays_rec
                           (p,iVar1,pTimes,(word *)(&iFanin_2 + (long)Delay * 2),pnSupp,nSuppAll,
                            pPermLits);
          nCounter = If_LogCounterPinDelays
                               (local_238,&local_1f0,(word *)&iFanin_2,fXor,
                                *(word *)(&iFanin_2 + (long)Delay * 2),nSuppAll,local_1ec);
          Delay = Delay + 1;
        }
        if (local_1f0 < 1) {
          __assert_fail("nCounter > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x880,
                        "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                       );
        }
        if (local_1ec != 0) {
          nCounter = If_LogCounterDelayXor(local_238,local_1f0);
        }
        wVar3 = If_LogPinDelaysMulti((word *)&iFanin_2,local_1f0,nSuppAll,local_1ec);
        *pRes = wVar3;
        p_local._4_4_ = nCounter;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutDsdBalancePinDelays_rec( If_DsdMan_t * p, int Id, int * pTimes, word * pRes, int * pnSupp, int nSuppAll, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var(pPermLits[(*pnSupp)++]);
        *pRes = If_CutPinDelayInit(iCutVar);
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        word pFaninRes[3], Res0, Res1;
        int i, iFanin, Delays[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        Res0 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[1], nSuppAll, 1 );
        Res1 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[2], nSuppAll, 1 );
        *pRes = If_CutPinDelayMax( Res0, Res1, nSuppAll, 1 );
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        assert( Vec_IntSize(vCover) > 0 );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        return If_CutSopBalancePinDelaysInt( vCover, Delays, pFaninRes, nSuppAll, pRes );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
            Result = If_LogCounterPinDelays( pCounter, &nCounter, pFaninRes, Delay, pFaninRes[i], nSuppAll, fXor );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        *pRes = If_LogPinDelaysMulti( pFaninRes, nCounter, nSuppAll, fXor );
        return Result;
    }
}